

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O2

STVar * __thiscall jbcoin::detail::STVar::operator=(STVar *this,STVar *rhs)

{
  STVar *pSVar1;
  STBase *pSVar2;
  
  if (rhs != this) {
    destroy(this);
    pSVar1 = (STVar *)rhs->p_;
    if (pSVar1 == rhs) {
      pSVar2 = (STBase *)(**(code **)(*(long *)&pSVar1->d_ + 0x18))(pSVar1,0x48,this);
      this->p_ = pSVar2;
    }
    else {
      this->p_ = (STBase *)pSVar1;
      rhs->p_ = (STBase *)0x0;
    }
  }
  return this;
}

Assistant:

STVar&
STVar::operator= (STVar&& rhs)
{
    if (&rhs != this)
    {
        destroy();
        if (rhs.on_heap())
        {
            p_ = rhs.p_;
            rhs.p_ = nullptr;
        }
        else
        {
            p_ = rhs.p_->move(max_size, &d_);
        }
    }

    return *this;
}